

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O3

CUIter * __thiscall
bloaty::dwarf::InfoReader::GetCUIter
          (CUIter *__return_storage_ptr__,InfoReader *this,Section section,uint64_t offset)

{
  File *pFVar1;
  ulong uVar2;
  char *pcVar3;
  string_view *psVar4;
  
  pFVar1 = this->dwarf_;
  psVar4 = &pFVar1->debug_types;
  if (section == kDebugInfo) {
    psVar4 = &pFVar1->debug_info;
  }
  uVar2 = psVar4->_M_len;
  if (offset <= uVar2) {
    psVar4 = &pFVar1->debug_info;
    if (section != kDebugInfo) {
      psVar4 = &pFVar1->debug_types;
    }
    pcVar3 = psVar4->_M_str;
    __return_storage_ptr__->section_ = section;
    (__return_storage_ptr__->next_unit_)._M_len = uVar2 - offset;
    (__return_storage_ptr__->next_unit_)._M_str = pcVar3 + offset;
    return __return_storage_ptr__;
  }
  Throw("premature EOF reading variable-length DWARF data",0xad);
}

Assistant:

CUIter InfoReader::GetCUIter(Section section, uint64_t offset) {
  string_view data;

  if (section == Section::kDebugInfo) {
    data = dwarf_.debug_info;
  } else {
    data = dwarf_.debug_types;
  }

  SkipBytes(offset, &data);
  return CUIter(section, data);
}